

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *end_00;
  uc16 separator;
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  unsigned_short *extraout_RDX;
  unsigned_short *extraout_RDX_00;
  unsigned_short *extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  unsigned_short *extraout_RDX_04;
  unsigned_short *extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long lVar10;
  unsigned_short *puVar11;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  int iVar12;
  byte bVar13;
  unsigned_short uVar14;
  byte bVar15;
  Double *this_00;
  uint uVar16;
  int iVar17;
  unsigned_short uVar18;
  ushort uVar19;
  int iVar20;
  long in_FS_OFFSET;
  float fVar21;
  double dVar22;
  DiyFp diy_fp;
  Vector<const_char> VVar23;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  undefined4 in_stack_fffffffffffffc40;
  char cVar24;
  uint uVar25;
  undefined4 uVar26;
  int local_3ac;
  undefined1 local_361;
  unsigned_short *end;
  unsigned_short *local_358;
  char *start;
  char buffer [782];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  end_00 = input + length;
  *processed_characters_count = 0;
  local_358 = input;
  end = end_00;
  if (length == 0) {
    dVar22 = this->empty_string_value_;
    goto LAB_0039935a;
  }
  uVar1 = this->flags_;
  if ((uVar1 & 0x18) != 0) {
    bVar4 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
    if (!bVar4) {
      *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
      dVar22 = this->empty_string_value_;
      goto LAB_0039935a;
    }
    if (local_358 == input || (char)((uVar1 & 8) >> 3) != '\0') goto LAB_003987ec;
LAB_00398862:
    dVar22 = this->junk_string_value_;
    goto LAB_0039935a;
  }
LAB_003987ec:
  uVar18 = *local_358;
  if ((uVar18 == 0x2d) || (uVar18 == 0x2b)) {
    bVar4 = uVar18 == 0x2d;
    puVar11 = local_358 + 1;
    buffer._0_8_ = puVar11;
    bVar5 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)buffer,end_00);
    if ((!bVar5) ||
       (puVar11 != (unsigned_short *)buffer._0_8_ && (char)((uVar1 & 0x20) >> 5) == '\0'))
    goto LAB_00398862;
    local_358 = (unsigned_short *)buffer._0_8_;
    uVar18 = *(unsigned_short *)buffer._0_8_;
  }
  else {
    bVar4 = false;
  }
  puVar11 = local_358;
  if (this->infinity_symbol_ == (char *)0x0) {
LAB_003988ff:
    if (this->nan_symbol_ != (char *)0x0) {
      bVar6 = SUB41((uVar1 & 0x40) >> 6,0);
      bVar5 = anon_unknown_0::ConsumeFirstCharacter((char)uVar18,this->nan_symbol_,bVar6);
      if (bVar5) {
        bVar5 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                          (&local_358,end_00,this->nan_symbol_,bVar6);
        if (!bVar5) goto LAB_00399354;
        if ((uVar1 & 0x14) == 0) {
          if (local_358 != end_00) goto LAB_00398d52;
LAB_00398d3c:
          bVar5 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
          if (bVar5) goto LAB_00398d52;
        }
        else if ((uVar1 & 4) == 0) goto LAB_00398d3c;
        *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
        if (bVar4 == false) {
          dVar22 = NAN;
        }
        else {
          dVar22 = -NAN;
        }
        goto LAB_0039935a;
      }
      uVar18 = *puVar11;
    }
    separator = this->separator_;
    bVar13 = 0;
    if (uVar18 != 0x30) {
LAB_00398981:
      uVar25 = 0;
      bVar5 = false;
      local_3ac = 0;
      iVar17 = 0;
      do {
        uVar19 = *local_358;
        puVar11 = (unsigned_short *)(ulong)(uVar19 - 0x30);
        if (9 < (ushort)(uVar19 - 0x30)) {
          bVar15 = bVar13;
          if (iVar17 == 0) {
            bVar15 = 0;
          }
          iVar12 = 0;
          if (uVar19 != 0x2e) goto LAB_00398dfb;
          if ((((byte)uVar1 >> 2 | ~bVar15) & 1) == 0) goto LAB_00398d52;
          iVar12 = 0;
          if ((bVar15 & 1) != 0) goto LAB_00398a37;
          bVar6 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
          if (bVar6) {
            puVar11 = extraout_RDX_00;
            bVar15 = bVar13;
            if (iVar17 != 0) goto LAB_00398a37;
            if (uVar18 != 0x30) goto LAB_00398d52;
            goto LAB_00398c59;
          }
          iVar12 = 0;
          if (iVar17 != 0) goto LAB_00398d94;
          iVar12 = 0;
          goto LAB_003991de;
        }
        if (iVar17 < 0x304) {
          lVar7 = (long)(int)uVar25;
          uVar25 = uVar25 + 1;
          buffer[lVar7] = (char)uVar19;
          iVar17 = iVar17 + 1;
        }
        else {
          local_3ac = local_3ac + 1;
          bVar5 = (bool)(uVar19 != 0x30 | bVar5);
        }
        bVar13 = bVar13 & uVar19 < 0x38;
        bVar6 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
      } while (!bVar6);
      iVar12 = 0;
      puVar11 = extraout_RDX;
      bVar15 = bVar13;
      goto LAB_00398a37;
    }
    bVar5 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
    if (!bVar5) {
      bVar13 = (byte)this->flags_;
      if (((this->flags_ & 0x81U) != 0) && ((*local_358 | 0x20) == 0x78)) {
        puVar11 = local_358 + 1;
        local_358 = puVar11;
        if (puVar11 != end_00) {
          if ((char)bVar13 < '\0') {
            bVar5 = false;
            start = (char *)puVar11;
            buffer._0_8_ = end_00;
            do {
              uVar19 = *(ushort *)start;
              bVar6 = isDigit((uint)uVar19,0x10);
              if (!bVar6) {
                if (uVar19 != 0x2e) goto LAB_00398f1d;
                bVar6 = Advance<unsigned_short_const*>
                                  ((unsigned_short **)&start,separator,0x10,
                                   (unsigned_short **)buffer);
                if (!bVar6) {
                  goto LAB_00398eb3;
                }
                break;
              }
              bVar6 = Advance<unsigned_short_const*>
                                ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer)
              ;
              bVar5 = true;
            } while (!bVar6);
          }
          goto LAB_00399026;
        }
        goto LAB_00398d52;
      }
      do {
        if (*local_358 != 0x30) {
          bVar13 = bVar13 >> 1;
          goto LAB_00398981;
        }
        bVar5 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
      } while (!bVar5);
    }
    *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
LAB_00398ad8:
    if (bVar4 == false) {
      dVar22 = 0.0;
    }
    else {
      dVar22 = -0.0;
    }
    goto LAB_0039935a;
  }
  bVar6 = SUB41((uVar1 & 0x40) >> 6,0);
  bVar5 = anon_unknown_0::ConsumeFirstCharacter((char)uVar18,this->infinity_symbol_,bVar6);
  if (!bVar5) {
    uVar18 = *puVar11;
    goto LAB_003988ff;
  }
  bVar5 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                    (&local_358,end_00,this->infinity_symbol_,bVar6);
  if (!bVar5) goto LAB_00399354;
  if ((uVar1 & 0x14) != 0) {
    if ((uVar1 & 4) == 0) goto LAB_00398cc0;
LAB_00398cd1:
    *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
    if (bVar4 == false) {
      dVar22 = INFINITY;
    }
    else {
      dVar22 = -INFINITY;
    }
    goto LAB_0039935a;
  }
  if (local_358 == end_00) {
LAB_00398cc0:
    bVar5 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
    if (!bVar5) goto LAB_00398cd1;
  }
  goto LAB_00398d52;
LAB_003991de:
  if (*local_358 != 0x30) goto LAB_00398d94;
  bVar6 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
  if (bVar6) {
    *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
    goto LAB_00398ad8;
  }
  iVar12 = iVar12 + -1;
  goto LAB_003991de;
LAB_00398d94:
  do {
    uVar19 = *local_358;
    puVar11 = (unsigned_short *)(ulong)(uVar19 - 0x30);
    if (9 < (ushort)(uVar19 - 0x30)) goto LAB_00398dfb;
    if (iVar17 < 0x304) {
      lVar7 = (long)(int)uVar25;
      uVar25 = uVar25 + 1;
      buffer[lVar7] = (char)uVar19;
      iVar17 = iVar17 + 1;
      iVar12 = iVar12 + -1;
    }
    else {
      bVar5 = (bool)(uVar19 != 0x30 | bVar5);
    }
    bVar6 = Advance<unsigned_short_const*>(&local_358,separator,10,&end);
    puVar11 = extraout_RDX_01;
  } while (!bVar6);
LAB_00398a37:
  if ((bVar15 & 1) == 0) {
    local_3ac = local_3ac + iVar12;
LAB_00398c59:
    if (bVar5) {
      lVar7 = (long)(int)uVar25;
      uVar25 = uVar25 + 1;
      buffer[lVar7] = '1';
      local_3ac = local_3ac + -1;
    }
    buffer[(int)uVar25] = '\0';
    VVar23.start_ = (char *)(ulong)uVar25;
    VVar23._8_8_ = puVar11;
    VVar23 = TrimTrailingZeros((double_conversion *)buffer,VVar23);
    local_3ac = (uVar25 - VVar23.length_) + local_3ac;
    auVar3 = VVar23._0_12_;
    if (read_as_double) {
      trimmed._12_4_ = 0;
      trimmed.start_ = (char *)auVar3._0_8_;
      trimmed.length_ = auVar3._8_4_;
      dVar22 = StrtodTrimmed(trimmed,local_3ac);
    }
    else {
      trimmed_00._12_4_ = 0;
      trimmed_00.start_ = (char *)auVar3._0_8_;
      trimmed_00.length_ = auVar3._8_4_;
      fVar21 = StrtofTrimmed(trimmed_00,local_3ac);
      dVar22 = (double)fVar21;
    }
    *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
    if (bVar4 != false) {
      dVar22 = -dVar22;
    }
    goto LAB_0039935a;
  }
  start = buffer;
  dVar22 = RadixStringToIeee<3,char*>
                     (&start,buffer + (int)uVar25,bVar4,separator,SUB41((uVar1 & 4) >> 2,0),
                      read_as_double,this->junk_string_value_,SUB81(&local_361,0),
                      (bool *)CONCAT44(uVar25,in_stack_fffffffffffffc40));
LAB_00398a99:
  *processed_characters_count = (int)((ulong)((long)local_358 - (long)input) >> 1);
  goto LAB_0039935a;
LAB_00398dfb:
  puVar11 = (unsigned_short *)CONCAT71((int7)((ulong)puVar11 >> 8),uVar18 != 0x30);
  if ((iVar17 != 0 || iVar12 != 0) || uVar18 == 0x30) {
    if ((uVar19 | 0x20) == 0x65) {
      if (((~bVar15 | (byte)uVar1 >> 2) & 1) != 0) {
        if ((bVar15 & 1) != 0) goto LAB_00398a37;
        puVar11 = local_358 + 1;
        if (puVar11 != end_00) {
          uVar18 = *puVar11;
          if ((uVar18 == 0x2d) || (uVar18 == 0x2b)) {
            puVar11 = local_358 + 2;
            if (puVar11 == end_00) goto LAB_0039933b;
          }
          else {
            uVar18 = 0x2b;
          }
          if ((puVar11 != end_00) && (uVar14 = *puVar11, 0xfff5 < (ushort)(uVar14 - 0x3a))) {
            uVar9 = 0;
            local_358 = puVar11;
            do {
              local_358 = local_358 + 1;
              if (((int)uVar9 < 0x6666666) ||
                 ((uVar16 = 0x3fffffff, uVar9 == 0x6666666 && (uVar14 < 0x34)))) {
                uVar16 = (uVar9 * 10 + (uint)uVar14) - 0x30;
              }
              uVar9 = uVar16;
            } while ((local_358 != end_00) && (uVar14 = *local_358, (ushort)(uVar14 - 0x30) < 10));
            uVar16 = -uVar9;
            if ((char)uVar18 != '-') {
              uVar16 = uVar9;
            }
            puVar11 = (unsigned_short *)(ulong)uVar16;
            iVar12 = iVar12 + uVar16;
            goto LAB_00398e5c;
          }
        }
LAB_0039933b:
        if ((uVar1 & 4) != 0) goto LAB_00398a37;
      }
    }
    else {
LAB_00398e5c:
      if ((uVar1 & 0x14) != 0) {
        if ((uVar1 & 4) == 0) {
LAB_00399193:
          bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
          puVar11 = extraout_RDX_04;
          if (bVar6) goto LAB_00399354;
        }
        if ((uVar1 & 0x10) != 0) {
          AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
          puVar11 = extraout_RDX_05;
        }
        goto LAB_00398a37;
      }
      if (local_358 == end_00) goto LAB_00399193;
    }
  }
LAB_00399354:
  dVar22 = this->junk_string_value_;
  goto LAB_0039935a;
LAB_00398f1d:
  if (((!bVar5) || ((uVar19 | 0x20) != 0x70)) ||
     (bVar5 = Advance<unsigned_short_const*>
                        ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer), bVar5)
     ) goto LAB_00399026;
  uVar19 = *(ushort *)start;
  if ((uVar19 == 0x2d) || (uVar19 == 0x2b)) {
    bVar5 = Advance<unsigned_short_const*>
                      ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer);
    if (bVar5) goto LAB_00399026;
    uVar19 = *(ushort *)start;
  }
  if ((0x39 < uVar19) || (9 < uVar19 - 0x30)) goto LAB_00399026;
  bVar5 = Advance<unsigned_short_const*>
                    ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer);
  if (!bVar5) {
    do {
      if ((0x39 < *(ushort *)start) || (9 < *(ushort *)start - 0x30)) {
        if ((uVar1 & 4) == 0) {
          bVar5 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)&start,end_00);
          uVar26 = 1;
          if (!bVar5) goto LAB_00399046;
          goto LAB_00399026;
        }
        break;
      }
      bVar5 = Advance<unsigned_short_const*>
                        ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer);
    } while (!bVar5);
  }
  uVar26 = 1;
LAB_00399046:
  dVar22 = this->junk_string_value_;
  buffer._0_8_ = end_00;
  do {
    uVar18 = *local_358;
    if (uVar18 != 0x30) {
      lVar7 = 0x18;
      if (read_as_double) {
        lVar7 = 0x35;
      }
      bVar5 = false;
      uVar25 = 0;
      this_00 = (Double *)0x0;
      lVar10 = lVar7;
      goto LAB_003990c8;
    }
    bVar5 = Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
  } while (!bVar5);
  if (bVar4 == false) {
    dVar22 = 0.0;
  }
  else {
    dVar22 = -0.0;
  }
LAB_0039957f:
  if ((uVar1 & 0x10) != 0) {
    AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00);
  }
  goto LAB_00398a99;
LAB_003990c8:
  cVar24 = (char)uVar26;
  uVar9 = uVar18 - 0x30;
  if (9 < uVar9) {
    if ((ushort)(uVar18 - 0x61) < 6) {
      uVar9 = uVar18 - 0x57;
      goto LAB_003990ef;
    }
    uVar9 = (uint)uVar18;
    if ((ushort)(uVar18 - 0x41) < 6) {
      uVar9 = uVar9 - 0x37;
      goto LAB_003990ef;
    }
    if (cVar24 == '\0') {
LAB_00399427:
      if (((uVar1 & 4) == 0) &&
         (bVar5 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00),
         lVar10 = extraout_RDX_09, bVar5)) goto LAB_0039935a;
      goto LAB_00399459;
    }
    if (uVar9 != 0x2e) {
      if ((uVar9 != 0x50) && (uVar9 != 0x70)) goto LAB_00399427;
      goto LAB_00399464;
    }
    Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
    bVar5 = true;
    lVar10 = extraout_RDX_03;
LAB_0039913f:
    uVar18 = *local_358;
    goto LAB_003990c8;
  }
LAB_003990ef:
  uVar16 = uVar25 - 4;
  if (!bVar5) {
    uVar16 = uVar25;
  }
  this_00 = (Double *)((ulong)uVar9 + (long)this_00 * 0x10);
  uVar8 = (long)this_00 >> (sbyte)lVar7;
  if ((int)uVar8 == 0) {
    bVar6 = Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
    cVar24 = (char)uVar26;
    lVar10 = extraout_RDX_02;
    uVar25 = uVar16;
    if (!bVar6) goto LAB_0039913f;
    goto LAB_00399459;
  }
  iVar17 = 0;
  bVar13 = 1;
  for (; 1 < (int)(uint)uVar8; uVar8 = (ulong)((uint)uVar8 >> 1)) {
    iVar17 = iVar17 + 1;
    bVar13 = bVar13 + 1;
  }
  uVar25 = (uint)this_00 & ~(-1 << (bVar13 & 0x1f));
  uVar8 = (long)this_00 >> (bVar13 & 0x3f);
  bVar13 = 1;
  iVar12 = iVar17 + uVar16 + 1;
  while( true ) {
    iVar20 = iVar12;
    bVar6 = Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
    cVar24 = (char)uVar26;
    lVar10 = extraout_RDX_06;
    if (bVar6) break;
    if ((cVar24 != '\0') && (*local_358 == 0x2e)) {
      Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
      bVar5 = true;
    }
    uVar19 = *local_358;
    bVar6 = isDigit((uint)uVar19,0x10);
    cVar24 = (char)uVar26;
    lVar10 = extraout_RDX_07;
    if (!bVar6) break;
    bVar13 = bVar13 & uVar19 == 0x30;
    iVar12 = iVar20 + 4;
    if (bVar5) {
      iVar12 = iVar20;
    }
  }
  if (((char)((uVar1 & 4) >> 2) == '\0' && cVar24 == '\0') &&
     (bVar5 = AdvanceToNonspace<unsigned_short_const*>(&local_358,end_00), lVar10 = extraout_RDX_08,
     bVar5)) goto LAB_0039935a;
  uVar9 = 1 << ((byte)iVar17 & 0x1f);
  if ((int)uVar9 < (int)uVar25) {
    uVar8 = uVar8 + 1;
  }
  else if (uVar25 == uVar9) {
    uVar8 = uVar8 + ((byte)(~bVar13 | (byte)uVar8) & 1);
  }
  bVar5 = (uVar8 >> lVar7 & 1) != 0;
  this_00 = (Double *)((long)uVar8 >> bVar5);
  uVar25 = iVar20 + (uint)bVar5;
LAB_00399459:
  if (cVar24 != '\0') {
LAB_00399464:
    Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
    bVar5 = false;
    bVar6 = false;
    if (*local_358 == 0x2b) {
LAB_00399499:
      bVar5 = bVar6;
      Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
      lVar10 = extraout_RDX_11;
    }
    else {
      lVar10 = extraout_RDX_10;
      if (*local_358 == 0x2d) {
        bVar6 = true;
        goto LAB_00399499;
      }
    }
    uVar9 = 0;
    do {
      if (9 < *local_358 - 0x30) break;
      uVar16 = -uVar9;
      if (0 < (int)uVar9) {
        uVar16 = uVar9;
      }
      if (uVar16 < 0x17bb1) {
        uVar9 = uVar9 * 10 + -0x30 + (uint)*local_358;
      }
      bVar6 = Advance<unsigned_short_const*>(&local_358,separator,0x10,(unsigned_short **)buffer);
      lVar10 = extraout_RDX_12;
    } while (!bVar6);
    uVar16 = -uVar9;
    if (!bVar5) {
      uVar16 = uVar9;
    }
    uVar25 = uVar16 + uVar25;
  }
  if ((uVar25 == 0) || (this_00 == (Double *)0x0)) {
    if (bVar4 != false) {
      if (this_00 == (Double *)0x0) {
        dVar22 = -0.0;
        goto LAB_0039957f;
      }
      this_00 = (Double *)-(long)this_00;
    }
    dVar22 = (double)(long)this_00;
  }
  else {
    diy_fp.f_ = (ulong)uVar25;
    diy_fp._8_8_ = lVar10;
    dVar22 = (double)Double::DiyFpToUint64(this_00,diy_fp);
    if (bVar4 != false) {
      dVar22 = -dVar22;
    }
  }
  goto LAB_0039957f;
  while( true ) {
    bVar6 = Advance<unsigned_short_const*>
                      ((unsigned_short **)&start,separator,0x10,(unsigned_short **)buffer);
    bVar5 = true;
    if (bVar6) break;
LAB_00398eb3:
    uVar19 = *(ushort *)start;
    bVar6 = isDigit((uint)uVar19,0x10);
    if (!bVar6) goto LAB_00398f1d;
  }
LAB_00399026:
  bVar5 = isDigit((uint)*puVar11,0x10);
  if (bVar5) {
    uVar26 = 0;
    goto LAB_00399046;
  }
LAB_00398d52:
  dVar22 = this->junk_string_value_;
LAB_0039935a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return dVar22;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}